

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::Colour::PayloadSize(Colour *this)

{
  uint64 uVar1;
  uint64_t uVar2;
  long *in_RDI;
  uint64_t size;
  MasteringMetadata *this_00;
  
  this_00 = (MasteringMetadata *)0x0;
  if (*in_RDI != -1) {
    uVar1 = EbmlElementSize(0,(uint64)in_RDI);
    this_00 = (MasteringMetadata *)((long)&this_00->luminance_max_ + uVar1);
  }
  if (in_RDI[1] != -1) {
    uVar1 = EbmlElementSize((uint64)this_00,(uint64)in_RDI);
    this_00 = (MasteringMetadata *)((long)&this_00->luminance_max_ + uVar1);
  }
  if (in_RDI[2] != -1) {
    uVar1 = EbmlElementSize((uint64)this_00,(uint64)in_RDI);
    this_00 = (MasteringMetadata *)((long)&this_00->luminance_max_ + uVar1);
  }
  if (in_RDI[3] != -1) {
    uVar1 = EbmlElementSize((uint64)this_00,(uint64)in_RDI);
    this_00 = (MasteringMetadata *)((long)&this_00->luminance_max_ + uVar1);
  }
  if (in_RDI[4] != -1) {
    uVar1 = EbmlElementSize((uint64)this_00,(uint64)in_RDI);
    this_00 = (MasteringMetadata *)((long)&this_00->luminance_max_ + uVar1);
  }
  if (in_RDI[5] != -1) {
    uVar1 = EbmlElementSize((uint64)this_00,(uint64)in_RDI);
    this_00 = (MasteringMetadata *)((long)&this_00->luminance_max_ + uVar1);
  }
  if (in_RDI[6] != -1) {
    uVar1 = EbmlElementSize((uint64)this_00,(uint64)in_RDI);
    this_00 = (MasteringMetadata *)((long)&this_00->luminance_max_ + uVar1);
  }
  if (in_RDI[7] != -1) {
    uVar1 = EbmlElementSize((uint64)this_00,(uint64)in_RDI);
    this_00 = (MasteringMetadata *)((long)&this_00->luminance_max_ + uVar1);
  }
  if (in_RDI[8] != -1) {
    uVar1 = EbmlElementSize((uint64)this_00,(uint64)in_RDI);
    this_00 = (MasteringMetadata *)((long)&this_00->luminance_max_ + uVar1);
  }
  if (in_RDI[9] != -1) {
    uVar1 = EbmlElementSize((uint64)this_00,(uint64)in_RDI);
    this_00 = (MasteringMetadata *)((long)&this_00->luminance_max_ + uVar1);
  }
  if (in_RDI[10] != -1) {
    uVar1 = EbmlElementSize((uint64)this_00,(uint64)in_RDI);
    this_00 = (MasteringMetadata *)((long)&this_00->luminance_max_ + uVar1);
  }
  if (in_RDI[0xb] != -1) {
    uVar1 = EbmlElementSize((uint64)this_00,(uint64)in_RDI);
    this_00 = (MasteringMetadata *)((long)&this_00->luminance_max_ + uVar1);
  }
  if (in_RDI[0xc] != -1) {
    uVar1 = EbmlElementSize((uint64)this_00,(uint64)in_RDI);
    this_00 = (MasteringMetadata *)((long)&this_00->luminance_max_ + uVar1);
  }
  if (in_RDI[0xd] != 0) {
    uVar2 = MasteringMetadata::MasteringMetadataSize(this_00);
    this_00 = (MasteringMetadata *)((long)&this_00->luminance_max_ + uVar2);
  }
  return (uint64_t)this_00;
}

Assistant:

uint64_t Colour::PayloadSize() const {
  uint64_t size = 0;

  if (matrix_coefficients_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvMatrixCoefficients,
                            static_cast<uint64>(matrix_coefficients_));
  }
  if (bits_per_channel_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvBitsPerChannel,
                            static_cast<uint64>(bits_per_channel_));
  }
  if (chroma_subsampling_horz_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvChromaSubsamplingHorz,
                            static_cast<uint64>(chroma_subsampling_horz_));
  }
  if (chroma_subsampling_vert_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvChromaSubsamplingVert,
                            static_cast<uint64>(chroma_subsampling_vert_));
  }
  if (cb_subsampling_horz_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvCbSubsamplingHorz,
                            static_cast<uint64>(cb_subsampling_horz_));
  }
  if (cb_subsampling_vert_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvCbSubsamplingVert,
                            static_cast<uint64>(cb_subsampling_vert_));
  }
  if (chroma_siting_horz_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvChromaSitingHorz,
                            static_cast<uint64>(chroma_siting_horz_));
  }
  if (chroma_siting_vert_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvChromaSitingVert,
                            static_cast<uint64>(chroma_siting_vert_));
  }
  if (range_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvRange, static_cast<uint64>(range_));
  }
  if (transfer_characteristics_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvTransferCharacteristics,
                            static_cast<uint64>(transfer_characteristics_));
  }
  if (primaries_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvPrimaries,
                            static_cast<uint64>(primaries_));
  }
  if (max_cll_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvMaxCLL, static_cast<uint64>(max_cll_));
  }
  if (max_fall_ != kValueNotPresent) {
    size +=
        EbmlElementSize(libwebm::kMkvMaxFALL, static_cast<uint64>(max_fall_));
  }

  if (mastering_metadata_)
    size += mastering_metadata_->MasteringMetadataSize();

  return size;
}